

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O1

void Fx_ManCubeDoubleCubeDivisors
               (Fx_Man_t *p,int iFirst,Vec_Int_t *vPivot,int fRemove,int fUpdate,int *fWarning)

{
  Vec_Int_t *vArr1;
  Vec_Que_t *p_00;
  int iVar1;
  int iVar2;
  uint v;
  Vec_Wec_t *pVVar3;
  float *pfVar4;
  Vec_Flt_t *pVVar5;
  int *piVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  
  pVVar3 = p->vCubes;
  if (iFirst < pVVar3->nSize) {
    uVar8 = (ulong)(uint)iFirst;
    do {
      if (iFirst < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                      ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      vArr1 = pVVar3->pArray + uVar8;
      iVar1 = pVVar3->pArray[uVar8].nSize;
      if ((vArr1 != vPivot && iVar1 != 0) &&
         ((((vArr1->nCap & 0x40000000) == 0 || (vArr1 <= vPivot)) ||
          ((vPivot->nCap & 0x40000000U) == 0)))) {
        if ((iVar1 < 1) || (vPivot->nSize < 1)) {
LAB_00266f61:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (*vArr1->pArray != *vPivot->pArray) {
          return;
        }
        iVar1 = Fx_ManDivFindCubeFree(vArr1,vPivot,p->vCubeFree,vPivot->pArray);
        if (p->vCubeFree->nSize == 4) {
          iVar2 = Fx_ManDivNormalize(p->vCubeFree);
          piVar6 = p->nDivMux;
          if ((iVar2 != 0) && (piVar6 = p->nDivMux + 1, iVar2 != 1)) {
            piVar6 = p->nDivMux + 2;
          }
          *piVar6 = *piVar6 + 1;
          if ((iVar2 < 0) && (p->fCanonDivs != 0)) goto LAB_00266c43;
        }
        if (((p->LitCountMax == 0) || (p->vCubeFree->nSize <= p->LitCountMax)) &&
           ((p->fCanonDivs == 0 || (p->vCubeFree->nSize != 3)))) {
          v = Hsh_VecManAdd(p->pHash,p->vCubeFree);
          if (fRemove == 0) {
            pVVar5 = p->vWeights;
            if (v == pVVar5->nSize) {
              iVar2 = p->vCubeFree->nSize;
              if ((long)iVar2 < 1) {
                iVar7 = 0;
              }
              else {
                lVar10 = 0;
                iVar7 = 0;
                do {
                  uVar11 = p->vCubeFree->pArray[lVar10];
                  if ((int)uVar11 < 0) {
                    __assert_fail("Lit >= 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                                  ,0xf2,"int Abc_Lit2Var(int)");
                  }
                  uVar11 = uVar11 >> 2;
                  if (p->vLevels->nSize <= (int)uVar11) goto LAB_00266f61;
                  iVar9 = p->vLevels->pArray[uVar11];
                  if (iVar7 <= iVar9) {
                    iVar7 = iVar9;
                  }
                  lVar10 = lVar10 + 1;
                } while (iVar2 != lVar10);
              }
              if (799 < iVar7) {
                iVar7 = 800;
              }
              uVar11 = pVVar5->nCap;
              if (pVVar5->nSize == uVar11) {
                if ((int)uVar11 < 0x10) {
                  if (pVVar5->pArray == (float *)0x0) {
                    pfVar4 = (float *)malloc(0x40);
                  }
                  else {
                    pfVar4 = (float *)realloc(pVVar5->pArray,0x40);
                  }
                  pVVar5->pArray = pfVar4;
                  iVar9 = 0x10;
                }
                else {
                  iVar9 = uVar11 * 2;
                  if (iVar9 <= (int)uVar11) goto LAB_00266ea2;
                  if (pVVar5->pArray == (float *)0x0) {
                    pfVar4 = (float *)malloc((ulong)uVar11 << 3);
                  }
                  else {
                    pfVar4 = (float *)realloc(pVVar5->pArray,(ulong)uVar11 << 3);
                  }
                  pVVar5->pArray = pfVar4;
                }
                pVVar5->nCap = iVar9;
              }
LAB_00266ea2:
              iVar9 = pVVar5->nSize;
              pVVar5->nSize = iVar9 + 1;
              pVVar5->pArray[iVar9] = (float)iVar7 * -0.0009 + (float)-iVar2 + 0.9;
            }
            pVVar5 = p->vWeights;
            if (pVVar5->nSize <= (int)v) {
              __assert_fail("iDiv < Vec_FltSize(p->vWeights)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                            ,0x359,
                            "void Fx_ManCubeDoubleCubeDivisors(Fx_Man_t *, int, Vec_Int_t *, int, int, int *)"
                           );
            }
            if ((int)v < 0) {
LAB_00266fbe:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecFlt.h"
                            ,0x195,"void Vec_FltAddToEntry(Vec_Flt_t *, int, float)");
            }
            iVar2 = p->vCubeFree->nSize + iVar1 + -1;
            iVar1 = 1;
          }
          else {
            pVVar5 = p->vWeights;
            if (pVVar5->nSize <= (int)v) {
              __assert_fail("iDiv < Vec_FltSize(p->vWeights)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                            ,0x35f,
                            "void Fx_ManCubeDoubleCubeDivisors(Fx_Man_t *, int, Vec_Int_t *, int, int, int *)"
                           );
            }
            if ((int)v < 0) goto LAB_00266fbe;
            iVar2 = 1 - (iVar1 + p->vCubeFree->nSize);
            iVar1 = -1;
          }
          pVVar5->pArray[v] = (float)iVar2 + pVVar5->pArray[v];
          p->nPairsD = p->nPairsD + iVar1;
          if (fUpdate != 0) {
            if ((int)v < 0) {
              __assert_fail("v >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecQue.h"
                            ,0xda,"int Vec_QueIsMember(Vec_Que_t *, int)");
            }
            p_00 = p->vPrio;
            if (((int)v < p_00->nCap) && (-1 < p_00->pOrder[v])) {
              Vec_QueUpdate(p_00,v);
            }
            else if (fRemove == 0) {
              Vec_QuePush(p_00,v);
            }
          }
        }
      }
LAB_00266c43:
      uVar8 = uVar8 + 1;
      pVVar3 = p->vCubes;
    } while ((int)uVar8 < pVVar3->nSize);
  }
  return;
}

Assistant:

void Fx_ManCubeDoubleCubeDivisors( Fx_Man_t * p, int iFirst, Vec_Int_t * vPivot, int fRemove, int fUpdate, int * fWarning )
{
    Vec_Int_t * vCube;
    int i, iDiv, Base;
    Vec_WecForEachLevelStart( p->vCubes, vCube, i, iFirst )
    {
        if ( Vec_IntSize(vCube) == 0 || vCube == vPivot )
            continue;
        if ( Vec_WecIntHasMark(vCube) && Vec_WecIntHasMark(vPivot) && vCube > vPivot )
            continue;
        if ( Vec_IntEntry(vCube, 0) != Vec_IntEntry(vPivot, 0) )
            break;
        Base = Fx_ManDivFindCubeFree( vCube, vPivot, p->vCubeFree, fWarning );
        if ( Vec_IntSize(p->vCubeFree) == 4 )
        { 
            int Value = Fx_ManDivNormalize( p->vCubeFree );
            if ( Value == 0 )
                p->nDivMux[0]++;
            else if ( Value == 1 )
                p->nDivMux[1]++;
            else
                p->nDivMux[2]++;
            if ( p->fCanonDivs && Value < 0 )
                continue;
        }
        if ( p->LitCountMax && p->LitCountMax < Vec_IntSize(p->vCubeFree) )
            continue;
        if ( p->fCanonDivs && Vec_IntSize(p->vCubeFree) == 3 )
            continue;
        iDiv = Hsh_VecManAdd( p->pHash, p->vCubeFree );
        if ( !fRemove )
        {
            if ( iDiv == Vec_FltSize(p->vWeights) )
                Vec_FltPush(p->vWeights, -Vec_IntSize(p->vCubeFree) + 0.9 - 0.0009 * Fx_ManComputeLevelDiv(p, p->vCubeFree));
            assert( iDiv < Vec_FltSize(p->vWeights) );
            Vec_FltAddToEntry( p->vWeights, iDiv, Base + Vec_IntSize(p->vCubeFree) - 1 );
            p->nPairsD++;
        }
        else
        {
            assert( iDiv < Vec_FltSize(p->vWeights) );
            Vec_FltAddToEntry( p->vWeights, iDiv, -(Base + Vec_IntSize(p->vCubeFree) - 1) );
            p->nPairsD--;
        }
        if ( fUpdate )
        {
            if ( Vec_QueIsMember(p->vPrio, iDiv) )
                Vec_QueUpdate( p->vPrio, iDiv );
            else if ( !fRemove )
                Vec_QuePush( p->vPrio, iDiv );
        }
    } 
}